

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusWindow(ImGuiWindow *window)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window_00;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow == window) {
    if (window == (ImGuiWindow *)0x0) {
      bVar1 = true;
      window_00 = (ImGuiWindow *)0x0;
      goto LAB_001e2da2;
    }
  }
  else {
    SetNavWindow(window);
    if (window == (ImGuiWindow *)0x0) {
      pIVar2->NavId = 0;
      pIVar2->NavFocusScopeId = 0;
      pIVar2->NavLayer = ImGuiNavLayer_Main;
      pIVar2->NavIdIsAlive = false;
      window_00 = (ImGuiWindow *)0x0;
      ClosePopupsOverWindow((ImGuiWindow *)0x0,false);
      bVar1 = true;
      goto LAB_001e2da2;
    }
    if (pIVar2->NavDisableMouseHover == true) {
      pIVar2->NavMousePosDirty = true;
    }
    pIVar2->NavId = window->NavLastIds[0];
    pIVar2->NavLayer = ImGuiNavLayer_Main;
    pIVar2->NavFocusScopeId = window->NavRootFocusScopeId;
    pIVar2->NavIdIsAlive = false;
    ClosePopupsOverWindow(window,false);
  }
  window_00 = window->RootWindow;
  bVar1 = false;
LAB_001e2da2:
  if ((((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (pIVar2->ActiveIdWindow->RootWindow != window_00)) &&
     (pIVar2->ActiveIdNoClearOnFocusLoss == false)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  if (!bVar1) {
    BringWindowToFocusFront(window_00);
    if (((uint)(window_00->Flags | window->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        SetNavWindow(window);
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavFocusScopeId = window ? window->NavRootFocusScopeId : 0;
        g.NavIdIsAlive = false;

        // Close popups if any
        ClosePopupsOverWindow(window, false);
    }

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}